

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsGetSymbolFromPropertyId(JsPropertyIdRef propertyId,JsValueRef *symbol)

{
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  undefined4 *puVar4;
  JavascriptSymbol *pJVar5;
  JsErrorCode exitStatus;
  undefined1 auStack_58 [8];
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_58 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
  }
  else {
    this = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&_actionEntryPopper.m_resultPtr,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (this->TTDShouldPerformRecordAction == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0xd68,"(false)","Need to implement support here!!!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    exitStatus = JsErrorInvalidArgument;
    if ((propertyId != (JsPropertyIdRef)0x0) && (0xf < *(uint *)((long)propertyId + 8))) {
      if (symbol == (JsValueRef *)0x0) {
        exitStatus = JsErrorNullArgument;
      }
      else {
        *symbol = (JsValueRef)0x0;
        exitStatus = JsErrorPropertyNotSymbol;
        if (*(char *)((long)propertyId + 0x12) == '\x01') {
          pJVar5 = Js::ScriptContext::GetSymbol(this,(PropertyRecord *)propertyId);
          *symbol = pJVar5;
          exitStatus = JsNoError;
        }
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&_actionEntryPopper.m_resultPtr);
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_58,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsGetSymbolFromPropertyId(_In_ JsPropertyIdRef propertyId, _Out_ JsValueRef *symbol)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(symbol);
        *symbol = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;
        if (!propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotSymbol;
        }

        *symbol = scriptContext->GetSymbol(propertyRecord);
        return JsNoError;
    });
}